

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O2

timeval __thiscall hrgls::Message::TimeStamp(Message *this)

{
  hrgls_Message phVar1;
  hrgls_Status hVar2;
  timeval tVar3;
  timeval ret;
  __time_t local_28;
  __suseconds_t _Stack_20;
  
  local_28 = 0;
  _Stack_20 = 0;
  phVar1 = this->m_private->Message;
  if (phVar1 == (hrgls_Message)0x0) {
    this->m_private->status = 0x3ee;
    _Stack_20 = 0;
    local_28 = 0;
  }
  else {
    hVar2 = hrgls_MessageGetTimeStamp(phVar1,&local_28);
    this->m_private->status = hVar2;
  }
  tVar3.tv_usec = _Stack_20;
  tVar3.tv_sec = local_28;
  return tVar3;
}

Assistant:

struct timeval Message::TimeStamp() const
  {
	  struct timeval ret = {};
	  if (!m_private->Message) {
		  m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
		  return ret;
	  }
	  m_private->status = hrgls_MessageGetTimeStamp(m_private->Message, &ret);
	  return ret;
  }